

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

TestStatus *
vkt::tessellation::anon_unknown_0::TessCoordComponent::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDefinition caseDef)

{
  pointer *ppVVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var2;
  undefined8 *puVar3;
  int *piVar4;
  TestLog *pTVar5;
  undefined8 uVar6;
  VkDeviceSize VVar7;
  VkDeviceSize __n;
  Allocation *pAVar8;
  undefined8 obj;
  char cVar9;
  deUint32 queueFamilyIndex;
  int iVar10;
  deUint32 stride;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  TextureFormat format;
  DescriptorSetLayoutBuilder *this;
  DescriptorPoolBuilder *this_00;
  DescriptorSetUpdateBuilder *this_01;
  GraphicsPipelineBuilder *pGVar11;
  const_iterator cVar12;
  TessPrimitiveType primitiveType;
  VkDevice pVVar13;
  long lVar14;
  pointer vec;
  int iVar15;
  DeviceInterface *vk;
  code *pcVar16;
  float fVar17;
  key_type local_5a8;
  vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
  tessLevelCases;
  VkDevice local_558;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> vertices;
  VkDeviceSize local_528;
  pointer pWStack_520;
  pointer local_518;
  VkAllocationCallbacks *pVStack_510;
  pointer local_500;
  pointer local_4f8;
  VkAllocationCallbacks *local_4f0;
  DeviceInterface *local_4e8;
  VkDeviceSize local_4e0;
  VkRenderPass local_4d8;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_4d0;
  VkPipelineLayout local_4b8;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_4b0;
  VkDescriptorSetLayout local_498;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_490;
  Buffer resultBuffer;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_440;
  VkCommandPool local_428;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_420;
  VkFramebuffer local_408;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_400;
  VkDescriptorPool local_3e8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_3e0;
  key_type local_3c8;
  Buffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  undefined8 uStack_360;
  undefined8 local_358;
  VkDescriptorPool VStack_350;
  Handle<(vk::HandleType)14> local_340;
  pointer local_338;
  pointer local_328;
  ios_base local_2f0 [132];
  deUint32 local_26c;
  bool local_268;
  VkPrimitiveTopology local_264;
  VkDescriptorBufferInfo resultBufferInfo;
  long *local_1c8 [2];
  long local_1b8 [2];
  Random rnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,9);
  local_4e8 = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  deRandom_init(&rnd.m_rnd,0x7b);
  tessLevelCases.
  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tessLevelCases.
  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tessLevelCases.
  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar15 = 0x20;
  do {
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,fVar17 * 62.0 + 1.0);
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    vertexBufferOffset = CONCAT44(fVar17 * 62.0 + 1.0,(undefined4)vertexBufferOffset);
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    uStack_360._0_4_ = fVar17 * 62.0 + 1.0;
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    uStack_360._4_4_ = fVar17 * 62.0 + 1.0;
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    local_358 = (pointer)CONCAT44(local_358._4_4_,fVar17 * 62.0 + 1.0);
    fVar17 = deRandom_getFloat(&rnd.m_rnd);
    local_358 = (pointer)CONCAT44(fVar17 * 62.0 + 1.0,(float)local_358);
    if (tessLevelCases.
        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        tessLevelCases.
        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>::
      _M_realloc_insert<vkt::tessellation::TessLevels_const&>
                ((vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>
                  *)&tessLevelCases,
                 (iterator)
                 tessLevelCases.
                 super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(TessLevels *)&vertexBufferOffset);
    }
    else {
      *(pointer *)
       ((tessLevelCases.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish)->outer + 2) = local_358;
      *(VkDeviceSize *)
       (tessLevelCases.
        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_finish)->inner = vertexBufferOffset;
      *(deUint64 *)
       (tessLevelCases.
        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_finish)->outer = uStack_360;
      tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           tessLevelCases.
           super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  iVar15 = 0;
  lVar14 = 8;
  do {
    iVar10 = referenceVertexCount
                       (caseDef.primitiveType,caseDef.spacingMode,caseDef.usePointMode,
                        (float *)((long)(tessLevelCases.
                                         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->inner +
                                 lVar14 + -8),
                        (float *)((long)(tessLevelCases.
                                         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->inner + lVar14)
                       );
    if (iVar15 <= iVar10) {
      iVar15 = iVar10;
    }
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x308);
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  stride = tcu::getPixelSize(format);
  makeBufferCreateInfo((VkBufferCreateInfo *)&vertexBufferOffset,(ulong)(stride * 6),0x80);
  vk = local_4e8;
  tessellation::Buffer::Buffer
            (&vertexBuffer,local_4e8,device,allocator,(VkBufferCreateInfo *)&vertexBufferOffset,
             (MemoryRequirement)0x1);
  local_4e0 = (long)(iVar15 + 4) * 0x10 + 0x10;
  makeBufferCreateInfo((VkBufferCreateInfo *)&vertexBufferOffset,local_4e0,0x20);
  tessellation::Buffer::Buffer
            (&resultBuffer,vk,device,allocator,(VkBufferCreateInfo *)&vertexBufferOffset,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&vertexBufferOffset);
  this = ::vk::DescriptorSetLayoutBuilder::addBinding
                   ((DescriptorSetLayoutBuilder *)&vertexBufferOffset,
                    VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,4,(VkSampler *)0x0);
  VVar7 = local_4e0;
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&rnd,this,vk,device,0);
  DStack_490.m_device = (VkDevice)local_198[0]._0_8_;
  DStack_490.m_allocator = (VkAllocationCallbacks *)local_198[0]._8_8_;
  local_498.m_internal._0_4_ = rnd.m_rnd.x;
  local_498.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_490.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  local_198[0]._M_allocated_capacity = (pointer)0x0;
  local_198[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if (local_338 != (pointer)0x0) {
    operator_delete(local_338,(long)local_328 - (long)local_338);
  }
  if ((VkAllocationCallbacks *)VStack_350.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_350.m_internal,local_340.m_internal - VStack_350.m_internal);
  }
  if (vertexBufferOffset != 0) {
    operator_delete((void *)vertexBufferOffset,(long)local_358 - vertexBufferOffset);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&rnd);
  this_00 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&rnd,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&vertexBufferOffset,this_00,vk,device,1,1);
  DStack_3e0.m_device = (VkDevice)local_358;
  DStack_3e0.m_allocator = (VkAllocationCallbacks *)VStack_350.m_internal;
  local_3e8.m_internal = vertexBufferOffset;
  DStack_3e0.m_deviceIface = (DeviceInterface *)uStack_360;
  vertexBufferOffset = 0;
  uStack_360 = 0;
  local_358 = (pointer)0x0;
  VStack_350.m_internal = 0;
  if (rnd.m_rnd._0_8_ != 0) {
    operator_delete((void *)rnd.m_rnd._0_8_,local_198[0]._M_allocated_capacity - rnd.m_rnd._0_8_);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&vertexBufferOffset,vk,device,local_3e8
                    ,local_498);
  local_518 = local_358;
  pVStack_510 = (VkAllocationCallbacks *)VStack_350.m_internal;
  local_528 = vertexBufferOffset;
  pWStack_520 = (pointer)uStack_360;
  resultBufferInfo.buffer.m_internal =
       resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = VVar7;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&vertexBufferOffset);
  this_01 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&vertexBufferOffset,(int)local_528,(void *)0x0,
                       0);
  ::vk::DescriptorSetUpdateBuilder::update(this_01,vk,device);
  if (local_338 != (pointer)0x0) {
    operator_delete(local_338,(long)local_328 - (long)local_338);
  }
  if ((VkAllocationCallbacks *)VStack_350.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_350.m_internal,local_340.m_internal - VStack_350.m_internal);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&vertexBufferOffset);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&vertexBufferOffset,vk,device);
  DStack_4d0.m_device = (VkDevice)local_358;
  DStack_4d0.m_allocator = (VkAllocationCallbacks *)VStack_350.m_internal;
  local_4d8.m_internal = vertexBufferOffset;
  DStack_4d0.m_deviceIface = (DeviceInterface *)uStack_360;
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset,vk,device,
             (VkRenderPass)vertexBufferOffset);
  DStack_400.m_device = (VkDevice)local_358;
  DStack_400.m_allocator = (VkAllocationCallbacks *)VStack_350.m_internal;
  local_408.m_internal = vertexBufferOffset;
  DStack_400.m_deviceIface = (DeviceInterface *)uStack_360;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&vertexBufferOffset,vk,device,
                     local_498);
  DStack_4b0.m_device = (VkDevice)local_358;
  DStack_4b0.m_allocator = (VkAllocationCallbacks *)VStack_350.m_internal;
  local_4b8.m_internal = vertexBufferOffset;
  DStack_4b0.m_deviceIface = (DeviceInterface *)uStack_360;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&vertexBufferOffset,vk,device,
                  queueFamilyIndex);
  DStack_420.m_device = (VkDevice)local_358;
  DStack_420.m_allocator = (VkAllocationCallbacks *)VStack_350.m_internal;
  local_428.m_internal = vertexBufferOffset;
  DStack_420.m_deviceIface = (DeviceInterface *)uStack_360;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&vertexBufferOffset,vk,device,
             (VkCommandPool)vertexBufferOffset,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar7 = vertexBufferOffset;
  local_500 = (pointer)uStack_360;
  local_4f8 = local_358;
  local_4f0 = (VkAllocationCallbacks *)VStack_350.m_internal;
  memset((GraphicsPipelineBuilder *)&vertexBufferOffset,0,0xfc);
  local_268 = false;
  local_264 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  local_26c = 6;
  pGVar11 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                      ((GraphicsPipelineBuilder *)&vertexBufferOffset,VK_FORMAT_R32_SFLOAT,stride);
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"vert","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,&local_5a8);
  pGVar11 = GraphicsPipelineBuilder::setShader
                      (pGVar11,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                       *(ProgramBinary **)(cVar12._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  ppVVar1 = &vertices.
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  vertices.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vertices,"tesc","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,(key_type *)&vertices);
  pGVar11 = GraphicsPipelineBuilder::setShader
                      (pGVar11,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                       *(ProgramBinary **)(cVar12._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"tese","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var2,&local_3c8);
  pGVar11 = GraphicsPipelineBuilder::setShader
                      (pGVar11,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                       *(ProgramBinary **)(cVar12._M_node + 2),(VkSpecializationInfo *)0x0);
  pVVar13 = device;
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&rnd,pGVar11,vk,device,local_4b8,local_4d8);
  obj = rnd.m_rnd._0_8_;
  DStack_440.m_device = (VkDevice)local_198[0]._0_8_;
  DStack_440.m_allocator = (VkAllocationCallbacks *)local_198[0]._8_8_;
  DStack_440.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  local_198[0]._M_allocated_capacity = (pointer)0x0;
  local_198[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if (vertices.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)ppVVar1) {
    operator_delete(vertices.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(vertices.
                                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)&vertexBufferOffset);
  local_558 = (VkDevice)0x0;
  do {
    primitiveType = (TessPrimitiveType)pVVar13;
    vertexBufferOffset = (VkDeviceSize)context->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_360);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_360,"Testing with tessellation levels: ",0x22);
    __n = local_4e0;
    getTessellationLevelsString_abi_cxx11_
              ((string *)&rnd,
               (tessellation *)
               (tessLevelCases.
                super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)local_558),
               (TessLevels *)(ulong)caseDef.primitiveType,primitiveType);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_360,(char *)rnd.m_rnd._0_8_,rnd.m_rnd._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&vertexBufferOffset,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rnd.m_rnd._0_8_ != local_198) {
      operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_360);
    std::ios_base::~ios_base(local_2f0);
    puVar3 = (undefined8 *)
             (vertexBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    puVar3[2] = *(undefined8 *)
                 (tessLevelCases.
                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)local_558].outer + 2);
    uVar6 = *(undefined8 *)
             tessLevelCases.
             super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)local_558].outer;
    *puVar3 = *(undefined8 *)
               tessLevelCases.
               super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)local_558].inner;
    puVar3[1] = uVar6;
    ::vk::flushMappedMemoryRange
              (vk,device,
               (VkDeviceMemory)
               ((vertexBuffer.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (vertexBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,0x18);
    pAVar8 = resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    memset((resultBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr,0,__n);
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)(pAVar8->m_memory).m_internal,pAVar8->m_offset,__n);
    beginCommandBuffer(vk,(VkCommandBuffer)VVar7);
    beginRenderPassWithRasterizationDisabled(vk,(VkCommandBuffer)VVar7,local_4d8,local_408);
    (*vk->_vptr_DeviceInterface[0x4c])(vk,VVar7,0,obj);
    (*vk->_vptr_DeviceInterface[0x56])(vk,VVar7,0,local_4b8.m_internal,0,1,&local_528,0,0);
    vertexBufferOffset = 0;
    (*vk->_vptr_DeviceInterface[0x58])
              (vk,VVar7,0,1,&vertexBuffer,(MessageBuilder *)&vertexBufferOffset);
    (*vk->_vptr_DeviceInterface[0x59])(vk,VVar7,6,1,0,0);
    endRenderPass(vk,(VkCommandBuffer)VVar7);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)&vertexBufferOffset,0x40,0x2000,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,0,__n);
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,VVar7,0x8000,0x4000,0,0,0,1,(MessageBuilder *)&vertexBufferOffset,0,0);
    endCommandBuffer(vk,(VkCommandBuffer)VVar7);
    submitCommandsAndWait(vk,device,queue,(VkCommandBuffer)VVar7);
    pAVar8 = resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    ::vk::invalidateMappedMemoryRange
              (vk,device,
               (VkDeviceMemory)
               ((resultBuffer.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (resultBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,__n);
    piVar4 = (int *)pAVar8->m_hostPtr;
    iVar15 = *piVar4;
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
              (&vertices,(long)iVar15,(allocator_type *)&rnd);
    if (0 < iVar15) {
      lVar14 = 0;
      do {
        *(int *)((long)(vertices.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14 + 8) = piVar4[6]
        ;
        *(undefined8 *)
         ((long)(vertices.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_data + lVar14) =
             *(undefined8 *)(piVar4 + 4);
        lVar14 = lVar14 + 0xc;
        piVar4 = piVar4 + 4;
      } while ((long)iVar15 * 0xc != lVar14);
    }
    pcVar16 = (code *)0x0;
    if (caseDef.caseType == CASETYPE_ONE_MINUS_TESS_COORD) {
      pcVar16 = compareOneMinusTessCoord;
    }
    if (caseDef.caseType == CASETYPE_TESS_COORD_RANGE) {
      pcVar16 = compareTessCoordRange;
    }
    if (vertices.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        vertices.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pTVar5 = context->m_testCtx->m_log;
      vec = vertices.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
      do {
        lVar14 = 0;
        do {
          cVar9 = (*pcVar16)(vec->m_data[lVar14],pTVar5);
          if (cVar9 == '\0') {
            vertexBufferOffset = (VkDeviceSize)pTVar5;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_360);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&uStack_360,"Note: got a wrong tessellation coordinate ",0x2a);
            if (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&rnd);
              tcu::operator<<((ostream *)&rnd,vec);
              std::__cxx11::stringbuf::str();
            }
            else {
              local_3c8._M_dataplus._M_p = *(pointer *)vec->m_data;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&rnd);
              tcu::operator<<((ostream *)&rnd,(Vector<float,_2> *)&local_3c8);
              std::__cxx11::stringbuf::str();
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd);
            std::ios_base::~ios_base(local_138);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&uStack_360,local_5a8._M_dataplus._M_p,local_5a8._M_string_length)
            ;
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&vertexBufferOffset,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
              operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_360);
            std::ios_base::~ios_base(local_2f0);
            vertexBufferOffset = (VkDeviceSize)&local_358;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&vertexBufferOffset,"Invalid tessellation coordinate component","")
            ;
            local_1c8[0] = local_1b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1c8,vertexBufferOffset,uStack_360 + vertexBufferOffset);
            if (local_1c8[0] != local_1b8) {
              operator_delete(local_1c8[0],local_1b8[0] + 1);
            }
            if ((undefined8 *)vertexBufferOffset != &local_358) {
              operator_delete((void *)vertexBufferOffset,
                              (ulong)((long)&(local_358->imageInfos).
                                             super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 1));
            }
          }
          lVar14 = lVar14 + 1;
        } while ((ulong)(caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES) + 2 != lVar14);
        vec = vec + 1;
      } while (vec != vertices.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (vertices.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vertices.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vertices.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vertices.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pVVar13 = local_558 + 1;
    vk = local_4e8;
    local_558 = pVVar13;
  } while (pVVar13 != (VkDevice)0x20);
  vertexBufferOffset = (VkDeviceSize)&local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vertexBufferOffset,"OK","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,vertexBufferOffset,
             uStack_360 + vertexBufferOffset);
  if ((undefined8 *)vertexBufferOffset != &local_358) {
    operator_delete((void *)vertexBufferOffset,
                    (ulong)((long)&(local_358->imageInfos).
                                   super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_440,(VkPipeline)obj);
  }
  if (VVar7 != 0) {
    vertexBufferOffset = VVar7;
    (*(code *)(local_500->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x18].sampler.m_internal)
              (local_500,local_4f8,local_4f0,1);
  }
  if (local_428.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_420,local_428);
  }
  if (local_4b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_4b0,local_4b8);
  }
  if (local_408.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_400,local_408);
  }
  if (local_4d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_4d0,local_4d8);
  }
  if (local_528 != 0) {
    vertexBufferOffset = local_528;
    (*(code *)(pWStack_520->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x14].imageView.m_internal)
              (pWStack_520,local_518,pVStack_510,1);
  }
  if (local_3e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_3e0,local_3e8);
  }
  if (local_498.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_490,local_498);
  }
  if (resultBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(resultBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (vertexBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(vertexBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tessLevelCases.
                    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)tessLevelCases.
                          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tessLevelCases.
                          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	const int						numTessLevelCases	= 32;
	const std::vector<TessLevels>	tessLevelCases		= genTessLevelCases(numTessLevelCases);

	int maxNumVerticesInDrawCall = 0;
	for (int i = 0; i < numTessLevelCases; ++i)
		maxNumVerticesInDrawCall = de::max(maxNumVerticesInDrawCall, referenceVertexCount(caseDef.primitiveType, caseDef.spacingMode, caseDef.usePointMode,
										   &tessLevelCases[i].inner[0], &tessLevelCases[i].outer[0]));

	// We may get more invocations than expected, so add some more space (arbitrary number).
	maxNumVerticesInDrawCall += 4;

	// Vertex input attributes buffer: to pass tessellation levels

	const VkFormat		vertexFormat        = VK_FORMAT_R32_SFLOAT;
	const deUint32		vertexStride        = tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize	vertexDataSizeBytes = NUM_TESS_LEVELS * vertexStride;
	const Buffer		vertexBuffer        (vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	DE_ASSERT(vertexDataSizeBytes == sizeof(TessLevels));

	// Output buffer: number of invocations and array of tess coords

	const int		   resultBufferTessCoordsOffset = (int)sizeof(deInt32) * 4;
	const VkDeviceSize resultBufferSizeBytes        = resultBufferTessCoordsOffset + maxNumVerticesInDrawCall * sizeof(tcu::Vec4);
	const Buffer       resultBuffer                 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	const Unique<VkRenderPass>     renderPass    (makeRenderPassWithoutAttachments (vk, device));
	const Unique<VkFramebuffer>    framebuffer   (makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout               (vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool       (makeCommandPool                  (vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (allocateCommandBuffer            (vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setPatchControlPoints        (NUM_TESS_LEVELS)
		.setVertexInputSingleAttribute(vertexFormat, vertexStride)
		.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get("tese"), DE_NULL)
		.build                        (vk, device, *pipelineLayout, *renderPass));

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < numTessLevelCases; ++tessLevelCaseNdx)
	{
		context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Testing with tessellation levels: " << getTessellationLevelsString(tessLevelCases[tessLevelCaseNdx], caseDef.primitiveType)
			<< tcu::TestLog::EndMessage;

		{
			const Allocation& alloc = vertexBuffer.getAllocation();
			deMemcpy(alloc.getHostPtr(), &tessLevelCases[tessLevelCaseNdx], sizeof(TessLevels));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(TessLevels));
		}
		{
			const Allocation& alloc = resultBuffer.getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
		}

		beginCommandBuffer(vk, *cmdBuffer);
		beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		vk.cmdDraw(*cmdBuffer, NUM_TESS_LEVELS, 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		{
			const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify case result
		{
			const Allocation& resultAlloc = resultBuffer.getAllocation();
			invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

			const deInt32				 numVertices = *static_cast<deInt32*>(resultAlloc.getHostPtr());
			const std::vector<tcu::Vec3> vertices    = readInterleavedData<tcu::Vec3>(numVertices, resultAlloc.getHostPtr(), resultBufferTessCoordsOffset, sizeof(tcu::Vec4));

			// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
			DE_ASSERT(numVertices <= maxNumVerticesInDrawCall);

			tcu::TestLog& log           = context.getTestContext().getLog();
			const int     numComponents = (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2);

			CompareFunc compare = (caseDef.caseType == CASETYPE_TESS_COORD_RANGE     ? compareTessCoordRange :
								   caseDef.caseType == CASETYPE_ONE_MINUS_TESS_COORD ? compareOneMinusTessCoord : DE_NULL);

			DE_ASSERT(compare != DE_NULL);

			for (std::vector<tcu::Vec3>::const_iterator vertexIter = vertices.begin(); vertexIter != vertices.end(); ++vertexIter)
			for (int i = 0; i < numComponents; ++i)
				if (!compare(log, (*vertexIter)[i]))
				{
						log << tcu::TestLog::Message << "Note: got a wrong tessellation coordinate "
							<< (numComponents == 3 ? de::toString(*vertexIter) : de::toString(vertexIter->swizzle(0,1))) << tcu::TestLog::EndMessage;

						tcu::TestStatus::fail("Invalid tessellation coordinate component");
				}
		}
	}
	return tcu::TestStatus::pass("OK");
}